

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_attention.h
# Opt level: O1

void __thiscall
shift_window_transformer::WindowAttention<float>::reArrange
          (WindowAttention<float> *this,Tensor<float> *input,Tensor<float> *output)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  pointer pfVar8;
  pointer pfVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  long local_68;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  piVar7 = (input->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(input->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)piVar7 == 0xc) {
    iVar1 = *piVar7;
    iVar2 = piVar7[1];
    local_38 = this->windowSize;
    local_40 = this->heads;
    iVar11 = piVar7[2] / local_40;
    local_3c = (iVar2 / local_38) * (iVar1 / local_38);
    local_38 = local_38 * local_38;
    local_34 = iVar11;
    std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
              ((vector<int,std::allocator<int>> *)&output->shape,&local_40);
    std::vector<float,_std::allocator<float>_>::resize
              (&output->super_vector<float,_std::allocator<float>_>,
               (long)(input->super_vector<float,_std::allocator<float>_>).
                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(input->super_vector<float,_std::allocator<float>_>).
                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2);
    if (0 < iVar1) {
      piVar7 = (input->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar3 = piVar7[2];
      iVar4 = *piVar7;
      iVar5 = piVar7[1];
      iVar6 = this->windowSize;
      local_68 = 0;
      iVar12 = 0;
      do {
        if (0 < iVar2) {
          pfVar8 = (input->super_vector<float,_std::allocator<float>_>).
                   super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
                   ._M_start;
          pfVar9 = (output->super_vector<float,_std::allocator<float>_>).
                   super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
                   ._M_start;
          iVar13 = 0;
          lVar15 = local_68;
          do {
            if (0 < (int)uVar3) {
              uVar14 = 0;
              do {
                uVar10 = (ulong)(uint)((int)uVar14 >> 0x1f) << 0x20 | uVar14 & 0xffffffff;
                pfVar9[((int)((long)uVar10 / (long)iVar11) * iVar4 * iVar5 +
                       ((iVar13 / iVar6 + (iVar12 / iVar6) * (iVar4 / iVar6)) * iVar6 +
                       iVar12 % iVar6) * iVar6 + iVar13 % iVar6) * iVar11 +
                       (int)((long)uVar10 % (long)iVar11)] = pfVar8[(int)lVar15 + (int)uVar14];
                uVar14 = uVar14 + 1;
              } while (uVar3 != uVar14);
            }
            iVar13 = iVar13 + 1;
            lVar15 = lVar15 + (ulong)uVar3;
          } while (iVar13 != iVar2);
        }
        iVar12 = iVar12 + 1;
        local_68 = local_68 + (ulong)(uVar3 * iVar5);
      } while (iVar12 != iVar1);
    }
    return;
  }
  __assert_fail("input.shape.size() == 3",
                "/workspace/llm4binary/github/license_c_cmakelists/dianhsu[P]swin-transformer-cpp/model/window_attention.h"
                ,0x42,
                "void shift_window_transformer::WindowAttention<float>::reArrange(const Tensor<T> &, Tensor<T> &) [T = float]"
               );
}

Assistant:

void reArrange(const Tensor<T> &input, Tensor<T> &output) {
            assert(input.shape.size() == 3);
            int n_h = input.shape[0], n_w = input.shape[1];
            int nw_h = input.shape[0] / windowSize, nw_w = input.shape[1] / windowSize;
            int dim = input.shape[2] / heads;
            output.shape = {heads, nw_h * nw_w, windowSize * windowSize, dim};
            output.resize(input.size());
            int lock_j = input.shape[2];
            int lock_i = lock_j * input.shape[1];
            int key_c = dim;
            int key_b = key_c * windowSize * windowSize;
            int key_a = key_c * input.shape[0] * input.shape[1];
            for (int i = 0; i < n_h; ++i) {
                for (int j = 0; j < n_w; ++j) {
                    for (int k = 0; k < input.shape[2]; ++k) {
                        int a = k / dim;
                        int b = i / windowSize * (input.shape[0] / windowSize) + j / windowSize;
                        int c = i % windowSize * windowSize + j % windowSize;
                        int d = k % dim;
                        output[a * key_a + b * key_b + c * key_c + d] = input[i * lock_i + j * lock_j + k];
                    }
                }
            }
        }